

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O3

void ncnn::im2col_sgemm_pack8to4_int8_sse_avx2
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  undefined1 auVar1 [16];
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  int *piVar16;
  uint uVar17;
  undefined1 (*pauVar18) [16];
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  void *pvVar22;
  long lVar23;
  ulong uVar24;
  undefined8 *puVar25;
  long lVar26;
  undefined1 (*pauVar27) [32];
  long lVar28;
  int iVar29;
  ulong uVar30;
  undefined1 (*pauVar31) [16];
  undefined8 *puVar32;
  undefined1 (*pauVar33) [32];
  long lVar34;
  int iVar35;
  ulong uVar36;
  int nn;
  int iVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [64];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 local_108 [64];
  size_t local_c8;
  ulong local_c0;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  undefined1 local_58 [32];
  
  uVar2 = bottom_im2col->w;
  uVar36 = (ulong)(int)uVar2;
  iVar37 = bottom_im2col->h;
  uVar21 = bottom_im2col->c;
  uVar19 = (ulong)uVar21;
  local_c0 = (ulong)(uint)top_blob->c;
  local_c8 = 0;
  local_108._0_8_ = (void *)0x0;
  local_108._8_4_ = 0;
  local_108._12_4_ = 0;
  local_108._16_8_ = 0;
  local_108._24_4_ = 0;
  local_108._32_8_ = (Allocator *)0x0;
  local_108._40_4_ = 0;
  local_108._44_4_ = 0;
  local_108._48_12_ = SUB1612((undefined1  [16])0x0,4);
  if ((long)uVar36 < 4) {
    uVar17 = uVar2;
    iVar35 = iVar37;
    if (1 < (int)uVar2) {
      iVar35 = iVar37 * 2;
      uVar17 = (uVar2 & 1) + 1;
    }
  }
  else {
    uVar17 = (uVar2 & 1) + (uVar2 >> 2) + (uint)((uVar2 >> 1 & 1) != 0);
    iVar35 = iVar37 * 4;
  }
  Mat::create((Mat *)local_108,iVar35,uVar21,uVar17,8,8,opt->workspace_allocator);
  uVar17 = (int)uVar2 >> 2;
  if (0 < (int)uVar17) {
    lVar23 = 0;
    uVar24 = 0;
    do {
      if (0 < (int)uVar21) {
        pauVar27 = (undefined1 (*) [32])(local_c8 * uVar24 * local_108._16_8_ + local_108._0_8_);
        uVar30 = 0;
        do {
          if (0 < iVar37) {
            pauVar33 = (undefined1 (*) [32])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar30 + lVar23);
            iVar35 = iVar37;
            do {
              *pauVar27 = *pauVar33;
              pauVar27 = pauVar27 + 1;
              pauVar33 = (undefined1 (*) [32])(*pauVar33 + (ulong)uVar2 * 8);
              iVar35 = iVar35 + -1;
            } while (iVar35 != 0);
          }
          uVar30 = uVar30 + 1;
        } while (uVar30 != uVar19);
      }
      uVar24 = uVar24 + 1;
      lVar23 = lVar23 + 0x20;
    } while (uVar24 != uVar17);
  }
  uVar20 = uVar2 >> 1 & 1;
  if ((uVar20 != 0) && (0 < (int)uVar21)) {
    pauVar18 = (undefined1 (*) [16])
               ((long)(int)uVar17 * local_c8 * local_108._16_8_ + local_108._0_8_);
    uVar24 = 0;
    do {
      if (0 < iVar37) {
        pauVar31 = (undefined1 (*) [16])
                   ((long)bottom_im2col->data +
                   bottom_im2col->cstep * bottom_im2col->elemsize * uVar24 +
                   (uVar36 & 0xfffffffffffffffc) * 8);
        iVar35 = iVar37;
        do {
          *pauVar18 = *pauVar31;
          pauVar18 = pauVar18 + 1;
          pauVar31 = (undefined1 (*) [16])(*pauVar31 + uVar36 * 8);
          iVar35 = iVar35 + -1;
        } while (iVar35 != 0);
      }
      uVar24 = uVar24 + 1;
    } while (uVar24 != uVar19);
  }
  iVar35 = (int)(uVar36 & 0xfffffffffffffffc) + uVar20 * 2;
  if (iVar35 < (int)uVar2) {
    uVar24 = (ulong)iVar35;
    pvVar22 = (void *)(uVar24 * 8 + (long)bottom_im2col->data);
    do {
      if (0 < (int)uVar21) {
        iVar29 = (int)uVar24;
        iVar35 = iVar29 + 3;
        if (-1 < iVar29) {
          iVar35 = iVar29;
        }
        puVar25 = (undefined8 *)
                  ((long)(int)((int)((char)((char)uVar24 - ((byte)iVar35 & 0xfc)) / '\x02') +
                              (iVar35 >> 2) +
                              (iVar29 - (((uint)(uVar24 >> 0x1f) & 1) + iVar29 & 0xfffffffe))) *
                   local_c8 * local_108._16_8_ + local_108._0_8_);
        uVar30 = 0;
        do {
          if (0 < iVar37) {
            puVar32 = (undefined8 *)
                      (bottom_im2col->cstep * bottom_im2col->elemsize * uVar30 + (long)pvVar22);
            iVar35 = iVar37;
            do {
              *puVar25 = *puVar32;
              puVar25 = puVar25 + 1;
              puVar32 = puVar32 + uVar36;
              iVar35 = iVar35 + -1;
            } while (iVar35 != 0);
          }
          uVar30 = uVar30 + 1;
        } while (uVar30 != uVar19);
      }
      uVar24 = uVar24 + 1;
      pvVar22 = (void *)((long)pvVar22 + 8);
    } while (uVar24 != uVar36);
  }
  if (0 < (int)local_c0) {
    iVar37 = uVar21 * iVar37;
    uVar19 = 0;
    auVar39 = vpmovsxbd_avx2(ZEXT816(0x603000007020000));
    auVar48 = ZEXT3264(auVar39);
    auVar39 = vpmovsxbd_avx2(ZEXT816(0x60300000702));
    auVar49 = ZEXT3264(auVar39);
    auVar39 = vpmovsxbd_avx2(ZEXT816(0x401000005000000));
    auVar50 = ZEXT3264(auVar39);
    do {
      pauVar27 = (undefined1 (*) [32])
                 (top_blob->cstep * uVar19 * top_blob->elemsize + (long)top_blob->data);
      if ((int)uVar2 < 4) {
        uVar24 = 0;
      }
      else {
        lVar23 = 0;
        uVar30 = 0;
        do {
          if (iVar37 < 1) {
            local_98._0_16_ = ZEXT816(0);
            local_98 = ZEXT1632(local_98._0_16_);
            auVar43 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar41 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar38 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            local_b8._0_16_ = ZEXT816(0);
            local_b8 = ZEXT1632(local_b8._0_16_);
            auVar44 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar40 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar39 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          }
          else {
            lVar26 = local_c8 * local_108._16_8_ * lVar23;
            lVar28 = kernel->cstep * uVar19 * kernel->elemsize;
            auVar46 = ZEXT1664((undefined1  [16])0x0);
            lVar34 = 0;
            auVar47 = ZEXT1664((undefined1  [16])0x0);
            auVar45 = ZEXT1664((undefined1  [16])0x0);
            local_b8._0_16_ = ZEXT816(0);
            local_b8 = ZEXT1632(local_b8._0_16_);
            auVar48 = ZEXT1664((undefined1  [16])0x0);
            auVar49 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar50 = ZEXT1664(ZEXT816(0) << 0x40);
            local_98._0_16_ = ZEXT816(0);
            local_98 = ZEXT1632(local_98._0_16_);
            iVar35 = iVar37;
            do {
              local_78 = auVar50._0_32_;
              local_58 = auVar49._0_32_;
              auVar44 = vpmovsxbw_avx2(*(undefined1 (*) [16])(local_108._0_8_ + lVar34 + lVar26));
              auVar41 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)kernel->data + lVar34 + lVar28))
              ;
              auVar11 = vpmullw_avx2(auVar41,auVar44);
              auVar7 = vpmulhw_avx2(auVar44,auVar41);
              auVar38 = vpermq_avx2(auVar44,0x4e);
              auVar12 = vpmullw_avx2(auVar41,auVar38);
              auVar8 = vpmulhw_avx2(auVar41,auVar38);
              auVar39 = vpunpcklwd_avx2(auVar11,auVar7);
              auVar39 = vpaddd_avx2(auVar46._0_32_,auVar39);
              auVar40 = vpunpcklwd_avx2(auVar12,auVar8);
              auVar40 = vpaddd_avx2(auVar47._0_32_,auVar40);
              auVar43 = vpmovsxbw_avx2(*(undefined1 (*) [16])
                                        ((long)kernel->data + lVar34 + lVar28 + 0x10));
              auVar13 = vpmullw_avx2(auVar44,auVar43);
              auVar9 = vpmulhw_avx2(auVar44,auVar43);
              auVar44 = vpunpcklwd_avx2(auVar13,auVar9);
              auVar44 = vpaddd_avx2(auVar45._0_32_,auVar44);
              auVar14 = vpmullw_avx2(auVar38,auVar43);
              auVar10 = vpmulhw_avx2(auVar38,auVar43);
              auVar38 = vpunpcklwd_avx2(auVar14,auVar10);
              auVar38 = vpaddd_avx2(auVar38,local_b8);
              auVar7 = vpunpckhwd_avx2(auVar11,auVar7);
              auVar39 = vpaddd_avx2(auVar7,auVar39);
              auVar46 = ZEXT3264(auVar39);
              auVar7 = vpunpckhwd_avx2(auVar12,auVar8);
              auVar40 = vpaddd_avx2(auVar40,auVar7);
              auVar47 = ZEXT3264(auVar40);
              auVar7 = vpunpckhwd_avx2(auVar13,auVar9);
              auVar44 = vpaddd_avx2(auVar44,auVar7);
              auVar45 = ZEXT3264(auVar44);
              auVar8 = vpunpckhwd_avx2(auVar14,auVar10);
              auVar7 = vpmovsxbw_avx2(*(undefined1 (*) [16])
                                       (local_108._0_8_ + lVar34 + lVar26 + 0x10));
              local_b8 = vpaddd_avx2(auVar38,auVar8);
              auVar12 = vpmullw_avx2(auVar41,auVar7);
              auVar8 = vpmulhw_avx2(auVar41,auVar7);
              auVar38 = vpermq_avx2(auVar7,0x4e);
              auVar13 = vpmullw_avx2(auVar41,auVar38);
              auVar9 = vpmulhw_avx2(auVar41,auVar38);
              auVar14 = vpmullw_avx2(auVar7,auVar43);
              auVar10 = vpmulhw_avx2(auVar7,auVar43);
              auVar15 = vpmullw_avx2(auVar38,auVar43);
              auVar11 = vpmulhw_avx2(auVar38,auVar43);
              auVar38 = vpunpcklwd_avx2(auVar12,auVar8);
              auVar38 = vpaddd_avx2(auVar48._0_32_,auVar38);
              auVar41 = vpunpcklwd_avx2(auVar13,auVar9);
              auVar41 = vpaddd_avx2(auVar41,local_58);
              auVar43 = vpunpcklwd_avx2(auVar14,auVar10);
              auVar43 = vpaddd_avx2(auVar43,local_78);
              auVar7 = vpunpcklwd_avx2(auVar15,auVar11);
              auVar7 = vpaddd_avx2(auVar7,local_98);
              auVar8 = vpunpckhwd_avx2(auVar12,auVar8);
              auVar38 = vpaddd_avx2(auVar38,auVar8);
              auVar48 = ZEXT3264(auVar38);
              auVar8 = vpunpckhwd_avx2(auVar13,auVar9);
              auVar41 = vpaddd_avx2(auVar41,auVar8);
              auVar49 = ZEXT3264(auVar41);
              auVar8 = vpunpckhwd_avx2(auVar14,auVar10);
              auVar43 = vpaddd_avx2(auVar43,auVar8);
              auVar50 = ZEXT3264(auVar43);
              auVar8 = vpunpckhwd_avx2(auVar15,auVar11);
              local_98 = vpaddd_avx2(auVar7,auVar8);
              lVar34 = lVar34 + 0x20;
              iVar35 = iVar35 + -1;
            } while (iVar35 != 0);
          }
          auVar10 = vpunpckldq_avx2(auVar39,auVar40);
          auVar11 = vpunpckldq_avx2(auVar44,local_b8);
          auVar40 = vpunpckhdq_avx2(auVar39,auVar40);
          auVar7 = vpunpckhdq_avx2(auVar44,local_b8);
          auVar12 = vpunpckldq_avx2(auVar38,auVar41);
          auVar13 = vpunpckldq_avx2(auVar43,local_98);
          auVar8 = vpunpckhdq_avx2(auVar38,auVar41);
          auVar9 = vpunpckhdq_avx2(auVar43,local_98);
          auVar44 = vpmovsxbd_avx2(ZEXT816(0x603000007020000));
          auVar48 = ZEXT3264(auVar44);
          auVar39 = vpermd_avx2(auVar44,auVar11);
          auVar38 = vpmovsxbd_avx2(ZEXT816(0x60300000702));
          auVar49 = ZEXT3264(auVar38);
          auVar41 = vpermd_avx2(auVar38,auVar10);
          auVar39 = vpblendd_avx2(auVar41,auVar39,0xcc);
          auVar41 = vpmovsxbd_avx2(ZEXT816(0x401000005000000));
          auVar50 = ZEXT3264(auVar41);
          auVar11 = vpermd_avx2(auVar41,auVar11);
          auVar43 = vpmovsxbd_avx2(ZEXT816(0x40100000500));
          auVar10 = vpermd_avx2(auVar43,auVar10);
          auVar10 = vpblendd_avx2(auVar10,auVar11,0xcc);
          auVar39 = vpaddd_avx2(auVar39,auVar10);
          auVar10 = vpermd_avx2(auVar44,auVar7);
          auVar11 = vpermd_avx2(auVar38,auVar40);
          auVar10 = vpblendd_avx2(auVar11,auVar10,0xcc);
          auVar7 = vpermd_avx2(auVar41,auVar7);
          auVar40 = vpermd_avx2(auVar43,auVar40);
          auVar40 = vpblendd_avx2(auVar40,auVar7,0xcc);
          auVar40 = vpaddd_avx2(auVar10,auVar40);
          auVar39 = vpaddd_avx2(auVar39,auVar40);
          auVar40 = vpermd_avx2(auVar44,auVar13);
          auVar7 = vpermd_avx2(auVar38,auVar12);
          auVar40 = vpblendd_avx2(auVar7,auVar40,0xcc);
          auVar7 = vpermd_avx2(auVar41,auVar13);
          auVar10 = vpermd_avx2(auVar43,auVar12);
          auVar7 = vpblendd_avx2(auVar10,auVar7,0xcc);
          auVar40 = vpaddd_avx2(auVar7,auVar40);
          auVar44 = vpermd_avx2(auVar44,auVar9);
          auVar38 = vpermd_avx2(auVar38,auVar8);
          auVar44 = vpblendd_avx2(auVar38,auVar44,0xcc);
          auVar38 = vpermd_avx2(auVar41,auVar9);
          auVar41 = vpermd_avx2(auVar43,auVar8);
          auVar38 = vpblendd_avx2(auVar41,auVar38,0xcc);
          auVar44 = vpaddd_avx2(auVar44,auVar38);
          auVar40 = vpaddd_avx2(auVar40,auVar44);
          *pauVar27 = auVar39;
          pauVar27[1] = auVar40;
          pauVar27 = pauVar27 + 2;
          uVar24 = uVar30 + 4;
          lVar26 = uVar30 + 7;
          lVar23 = lVar23 + 1;
          uVar30 = uVar24;
        } while (lVar26 < (long)uVar36);
      }
      if ((int)((uint)uVar24 | 1) < (int)uVar2) {
        uVar21 = 0;
        do {
          iVar35 = (int)uVar24;
          if (iVar37 < 1) {
            auVar38 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar44 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar40 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar39 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          }
          else {
            lVar23 = kernel->cstep * uVar19 * kernel->elemsize;
            auVar45 = ZEXT1664((undefined1  [16])0x0);
            lVar26 = 0;
            auVar42 = ZEXT1664((undefined1  [16])0x0);
            auVar47 = ZEXT1664((undefined1  [16])0x0);
            auVar46 = ZEXT1664((undefined1  [16])0x0);
            iVar29 = iVar37;
            do {
              auVar39 = vpmovsxbw_avx2(*(undefined1 (*) [16])
                                        (local_108._0_8_ +
                                        lVar26 + local_c8 * local_108._16_8_ *
                                                 (ulong)((uVar21 & 1) +
                                                        ((uint)(uVar24 >> 2) & 0x3fffffff))));
              auVar40 = vpmovsxbw_avx2(*(undefined1 (*) [16])
                                        ((long)kernel->data + lVar26 * 2 + lVar23));
              auVar44 = vpmovsxbw_avx2(*(undefined1 (*) [16])
                                        ((long)kernel->data + lVar26 * 2 + lVar23 + 0x10));
              auVar9 = vpmullw_avx2(auVar40,auVar39);
              auVar41 = vpmulhw_avx2(auVar39,auVar40);
              auVar38 = vpermq_avx2(auVar39,0x4e);
              auVar10 = vpmullw_avx2(auVar38,auVar40);
              auVar43 = vpmulhw_avx2(auVar38,auVar40);
              auVar11 = vpmullw_avx2(auVar44,auVar39);
              auVar7 = vpmulhw_avx2(auVar39,auVar44);
              auVar12 = vpmullw_avx2(auVar38,auVar44);
              auVar8 = vpmulhw_avx2(auVar38,auVar44);
              auVar39 = vpunpcklwd_avx2(auVar9,auVar41);
              auVar39 = vpaddd_avx2(auVar39,auVar45._0_32_);
              auVar40 = vpunpcklwd_avx2(auVar10,auVar43);
              auVar40 = vpaddd_avx2(auVar40,auVar42._0_32_);
              auVar44 = vpunpcklwd_avx2(auVar11,auVar7);
              auVar44 = vpaddd_avx2(auVar44,auVar47._0_32_);
              auVar38 = vpunpcklwd_avx2(auVar12,auVar8);
              auVar38 = vpaddd_avx2(auVar38,auVar46._0_32_);
              auVar41 = vpunpckhwd_avx2(auVar9,auVar41);
              auVar39 = vpaddd_avx2(auVar39,auVar41);
              auVar45 = ZEXT3264(auVar39);
              auVar41 = vpunpckhwd_avx2(auVar10,auVar43);
              auVar40 = vpaddd_avx2(auVar40,auVar41);
              auVar42 = ZEXT3264(auVar40);
              auVar41 = vpunpckhwd_avx2(auVar11,auVar7);
              auVar44 = vpaddd_avx2(auVar44,auVar41);
              auVar47 = ZEXT3264(auVar44);
              auVar41 = vpunpckhwd_avx2(auVar12,auVar8);
              auVar38 = vpaddd_avx2(auVar38,auVar41);
              auVar46 = ZEXT3264(auVar38);
              lVar26 = lVar26 + 0x10;
              iVar29 = iVar29 + -1;
            } while (iVar29 != 0);
          }
          auVar43 = vpunpckldq_avx2(auVar39,auVar40);
          auVar7 = vpunpckldq_avx2(auVar44,auVar38);
          auVar41 = vpunpckhdq_avx2(auVar39,auVar40);
          auVar44 = vpunpckhdq_avx2(auVar44,auVar38);
          auVar39 = vpermd_avx2(auVar48._0_32_,auVar7);
          auVar40 = vpermd_avx2(auVar49._0_32_,auVar43);
          auVar39 = vpblendd_avx2(auVar40,auVar39,0xcc);
          auVar38 = vpermd_avx2(auVar50._0_32_,auVar7);
          auVar40 = vpmovsxbd_avx2(ZEXT816(0x40100000500));
          auVar43 = vpermd_avx2(auVar40,auVar43);
          auVar38 = vpblendd_avx2(auVar43,auVar38,0xcc);
          auVar39 = vpaddd_avx2(auVar38,auVar39);
          auVar38 = vpermd_avx2(auVar48._0_32_,auVar44);
          auVar43 = vpermd_avx2(auVar49._0_32_,auVar41);
          auVar38 = vpblendd_avx2(auVar43,auVar38,0xcc);
          auVar44 = vpermd_avx2(auVar50._0_32_,auVar44);
          auVar40 = vpermd_avx2(auVar40,auVar41);
          auVar40 = vpblendd_avx2(auVar40,auVar44,0xcc);
          auVar40 = vpaddd_avx2(auVar38,auVar40);
          auVar39 = vpaddd_avx2(auVar39,auVar40);
          *pauVar27 = auVar39;
          pauVar27 = pauVar27 + 1;
          uVar17 = iVar35 + 2;
          uVar30 = (ulong)uVar17;
          uVar21 = (uint)(byte)((char)uVar21 + 1);
          uVar24 = (ulong)uVar17;
        } while (iVar35 + 3 < (int)uVar2);
      }
      else {
        uVar30 = uVar24 & 0xffffffff;
      }
      if ((int)uVar30 < (int)uVar2) {
        do {
          uVar21 = (uint)uVar30;
          if (iVar37 < 1) {
            auVar39 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar40 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          }
          else {
            pauVar18 = (undefined1 (*) [16])
                       (kernel->cstep * uVar19 * kernel->elemsize + (long)kernel->data);
            auVar45 = ZEXT1664((undefined1  [16])0x0);
            lVar23 = 0;
            auVar46 = ZEXT1664((undefined1  [16])0x0);
            do {
              auVar1._8_8_ = 0;
              auVar1._0_8_ = *(ulong *)(local_108._0_8_ +
                                       lVar23 * 8 +
                                       local_c8 * local_108._16_8_ *
                                       (ulong)((uVar21 & 1) + (int)(uVar30 >> 2) +
                                              (uint)((uVar21 >> 1 & 1) != 0)));
              auVar1 = vpmovsxbw_avx(auVar1);
              auVar39 = vpmovsxbw_avx2(*pauVar18);
              auVar40 = vpmovsxbw_avx2(pauVar18[1]);
              auVar38._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar1;
              auVar38._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
              auVar41 = vpmullw_avx2(auVar38,auVar39);
              auVar44 = vpmulhw_avx2(auVar38,auVar39);
              auVar43 = vpmullw_avx2(auVar38,auVar40);
              auVar38 = vpmulhw_avx2(auVar38,auVar40);
              auVar39 = vpunpcklwd_avx2(auVar41,auVar44);
              auVar39 = vpaddd_avx2(auVar46._0_32_,auVar39);
              auVar40 = vpunpcklwd_avx2(auVar43,auVar38);
              auVar40 = vpaddd_avx2(auVar45._0_32_,auVar40);
              auVar44 = vpunpckhwd_avx2(auVar41,auVar44);
              auVar39 = vpaddd_avx2(auVar39,auVar44);
              auVar46 = ZEXT3264(auVar39);
              auVar44 = vpunpckhwd_avx2(auVar43,auVar38);
              auVar40 = vpaddd_avx2(auVar40,auVar44);
              auVar45 = ZEXT3264(auVar40);
              pauVar18 = pauVar18 + 2;
              lVar23 = lVar23 + 1;
            } while (iVar37 != (int)lVar23);
          }
          auVar1 = vpunpckldq_avx(auVar39._0_16_,auVar39._16_16_);
          auVar5 = vpunpckldq_avx(auVar40._0_16_,auVar40._16_16_);
          auVar3 = vpunpckhdq_avx(auVar39._0_16_,auVar39._16_16_);
          auVar4 = vpunpckhdq_avx(auVar40._0_16_,auVar40._16_16_);
          auVar6 = vpunpcklqdq_avx(auVar1,auVar5);
          auVar1 = vpunpckhqdq_avx(auVar1,auVar5);
          auVar1 = vpaddd_avx(auVar6,auVar1);
          auVar5 = vpunpcklqdq_avx(auVar3,auVar4);
          auVar3 = vpunpckhqdq_avx(auVar3,auVar4);
          auVar3 = vpaddd_avx(auVar3,auVar5);
          auVar1 = vpaddd_avx(auVar1,auVar3);
          *(undefined1 (*) [16])*pauVar27 = auVar1;
          pauVar27 = (undefined1 (*) [32])(*pauVar27 + 0x10);
          uVar30 = (ulong)(uVar21 + 1);
        } while (uVar21 + 1 != uVar2);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != local_c0);
  }
  piVar16 = (int *)CONCAT44(local_108._12_4_,local_108._8_4_);
  if (piVar16 != (int *)0x0) {
    LOCK();
    *piVar16 = *piVar16 + -1;
    UNLOCK();
    if (*piVar16 == 0) {
      if ((Allocator *)local_108._32_8_ == (Allocator *)0x0) {
        if ((void *)local_108._0_8_ != (void *)0x0) {
          free((void *)local_108._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_108._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

void im2col_sgemm_pack8to4_int8_sse_avx2(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    im2col_sgemm_pack8to4_int8_sse(bottom_im2col, top_blob, kernel, opt);
}